

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O3

int select_next_proto_cb(SSL *ssl,uchar **out,uchar *outlen,uchar *in,uint inlen,void *arg)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  
  if (7 < inlen) {
    uVar1 = 0;
    do {
      uVar3 = uVar1 + 1;
      if (*(long *)(in + uVar3) == 0x312e312f70747468) {
        *out = in + uVar3;
        *outlen = in[uVar1];
        Curl_infof(*arg,"NPN, negotiated HTTP1.1\n");
        goto LAB_0014acb6;
      }
      uVar2 = (ulong)uVar1;
      uVar1 = uVar3 + in[uVar2];
    } while (uVar3 + in[uVar2] + 8 <= inlen);
  }
  Curl_infof(*arg,"NPN, no overlap, use HTTP1.1\n");
  *out = (uchar *)"http/1.1";
  *outlen = '\b';
LAB_0014acb6:
  *(undefined4 *)((long)arg + 0x630) = 2;
  return 0;
}

Assistant:

static int
select_next_proto_cb(SSL *ssl,
                     unsigned char **out, unsigned char *outlen,
                     const unsigned char *in, unsigned int inlen,
                     void *arg)
{
  struct connectdata *conn = (struct connectdata*) arg;

  (void)ssl;

#ifdef USE_NGHTTP2
  if(conn->data->set.httpversion >= CURL_HTTP_VERSION_2 &&
     !select_next_protocol(out, outlen, in, inlen, NGHTTP2_PROTO_VERSION_ID,
                           NGHTTP2_PROTO_VERSION_ID_LEN)) {
    infof(conn->data, "NPN, negotiated HTTP2 (%s)\n",
          NGHTTP2_PROTO_VERSION_ID);
    conn->negnpn = CURL_HTTP_VERSION_2;
    return SSL_TLSEXT_ERR_OK;
  }
#endif

  if(!select_next_protocol(out, outlen, in, inlen, ALPN_HTTP_1_1,
                           ALPN_HTTP_1_1_LENGTH)) {
    infof(conn->data, "NPN, negotiated HTTP1.1\n");
    conn->negnpn = CURL_HTTP_VERSION_1_1;
    return SSL_TLSEXT_ERR_OK;
  }

  infof(conn->data, "NPN, no overlap, use HTTP1.1\n");
  *out = (unsigned char *)ALPN_HTTP_1_1;
  *outlen = ALPN_HTTP_1_1_LENGTH;
  conn->negnpn = CURL_HTTP_VERSION_1_1;

  return SSL_TLSEXT_ERR_OK;
}